

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratio_tester_test.cc
# Opt level: O0

void __thiscall
fizplex::RatioTesterBounded_AlphaZeroAndNoUpperIsUnbounded_Test::TestBody
          (RatioTesterBounded_AlphaZeroAndNoUpperIsUnbounded_Test *this)

{
  bool bVar1;
  char *message;
  double in_stack_00000018;
  size_t in_stack_00000020;
  DVector *in_stack_00000028;
  SVector *in_stack_00000030;
  LP *in_stack_00000038;
  RatioTester *in_stack_00000040;
  AssertionResult gtest_ar;
  RatioTestResult res;
  IterationDecision *in_stack_ffffffffffffff80;
  IterationDecision *lhs;
  AssertionResult *this_00;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  AssertHelper local_60;
  Message local_58 [3];
  undefined4 local_3c;
  AssertionResult local_38;
  IterationDecision local_28 [10];
  
  lhs = local_28;
  RatioTester::ratio_test
            (in_stack_00000040,in_stack_00000038,in_stack_00000030,in_stack_00000028,
             in_stack_00000020,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)gtest_ar._0_8_,
             in_stack_00000018);
  local_3c = 0;
  this_00 = &local_38;
  testing::internal::EqHelper<false>::
  Compare<fizplex::Simplex::IterationDecision,fizplex::Simplex::IterationDecision>
            ((char *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98),
             &this_00->success_,lhs,in_stack_ffffffffffffff80);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_00);
  if (!bVar1) {
    testing::Message::Message(local_58);
    message = testing::AssertionResult::failure_message((AssertionResult *)0x1d6768);
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/ratio_tester_test.cc"
               ,0x17,message);
    testing::internal::AssertHelper::operator=(&local_60,local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    testing::Message::~Message((Message *)0x1d67b6);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d67f6);
  return;
}

Assistant:

TEST_F(RatioTesterBounded, AlphaZeroAndNoUpperIsUnbounded) {
  auto res = rt.ratio_test(lp, alpha, beta, cind, basic, ccost);
  EXPECT_EQ(Simplex::IterationDecision::Unbounded, res.result);
}